

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_multiplier.cpp
# Opt level: O1

Scale * __thiscall icu_63::number::Scale::operator=(Scale *this,Scale *src)

{
  this->fMagnitude = src->fMagnitude;
  this->fArbitrary = src->fArbitrary;
  this->fError = src->fError;
  src->fArbitrary = (DecNum *)0x0;
  return this;
}

Assistant:

Scale& Scale::operator=(Scale&& src) U_NOEXCEPT {
    fMagnitude = src.fMagnitude;
    fArbitrary = src.fArbitrary;
    fError = src.fError;
    // Take ownership away from src if necessary
    src.fArbitrary = nullptr;
    return *this;
}